

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O1

void mcmuse(mcmcx1def *ctx,mcmon obj)

{
  byte *pbVar1;
  ushort uVar2;
  mcmodef *pmVar3;
  mcmon n;
  ulong uVar4;
  undefined6 in_register_00000032;
  uint uVar5;
  
  uVar4 = CONCAT62(in_register_00000032,obj) & 0xffffffff;
  n = (mcmon)uVar4;
  if (ctx->mcmcxmru != n) {
    uVar5 = (obj & 0xff) << 5;
    pmVar3 = ctx->mcmcxtab[uVar4 >> 8];
    if ((*(byte *)((long)&pmVar3->mcmoflg + (ulong)uVar5) & 0x10) != 0) {
      mcmunl(ctx,n,&ctx->mcmcxlru);
    }
    uVar2 = ctx->mcmcxmru;
    if (uVar2 != 0xffff) {
      ctx->mcmcxtab[uVar2 >> 8][(byte)uVar2].mcmonxt = n;
    }
    *(mcmon *)((long)&pmVar3->mcmoprv + (ulong)uVar5) = ctx->mcmcxmru;
    *(undefined2 *)((long)&pmVar3->mcmonxt + (ulong)uVar5) = 0xffff;
    ctx->mcmcxmru = n;
    if (ctx->mcmcxlru == 0xffff) {
      ctx->mcmcxlru = n;
    }
    pbVar1 = (byte *)((long)&pmVar3->mcmoflg + (ulong)uVar5);
    *pbVar1 = *pbVar1 | 0x10;
  }
  return;
}

Assistant:

void mcmuse(mcmcx1def *ctx, mcmon obj)
{
    mcmodef   *o = mcmgobje(ctx, obj);
    
    MCMGLBCTX(ctx);

    if (ctx->mcmcxmru == obj) return;         /* already MRU; nothing to do */
    
    /* remove from LRU chain if it's in it */
    if (o->mcmoflg & MCMOFLRU) mcmunl(ctx, obj, &ctx->mcmcxlru);

    /* set forward pointer of last block, if there is one */
    if (ctx->mcmcxmru != MCMONINV)
        mcmgobje(ctx, ctx->mcmcxmru)->mcmonxt = obj;
    
    o->mcmoprv = ctx->mcmcxmru;               /* point back to previous MRU */
    o->mcmonxt = MCMONINV;                /* nothing in list after this one */
    ctx->mcmcxmru = obj;                          /* point MRU to new block */
    
    /* if there's nothing in the chain at all, set LRU to this block, too */
    if (ctx->mcmcxlru == MCMONINV) ctx->mcmcxlru = obj;

    /* note that object is in LRU chain */
    o->mcmoflg |= MCMOFLRU;
}